

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v9::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  ulong uVar1;
  char *__result;
  size_t free_cap;
  type count;
  char *end_local;
  char *begin_local;
  buffer<char> *this_local;
  
  for (end_local = begin; end_local != end; end_local = end_local + free_cap) {
    free_cap = to_unsigned<long>((long)end - (long)end_local);
    try_reserve(this,this->size_ + free_cap);
    uVar1 = this->capacity_ - this->size_;
    if (uVar1 < free_cap) {
      free_cap = uVar1;
    }
    __result = make_checked<char>(this->ptr_ + this->size_,free_cap);
    std::uninitialized_copy_n<char_const*,unsigned_long,char*>(end_local,free_cap,__result);
    this->size_ = free_cap + this->size_;
  }
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  while (begin != end) {
    auto count = to_unsigned(end - begin);
    try_reserve(size_ + count);
    auto free_cap = capacity_ - size_;
    if (free_cap < count) count = free_cap;
    std::uninitialized_copy_n(begin, count, make_checked(ptr_ + size_, count));
    size_ += count;
    begin += count;
  }
}